

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  streamoff sVar4;
  streamoff sVar5;
  reference pvVar6;
  long lVar7;
  streamoff extraout_RDX;
  float_t fVar8;
  span<const_float,_128L> in_stack_ffffffffffee8540;
  streamoff in_stack_ffffffffffee8558;
  __mbstate_t in_stack_ffffffffffee8560;
  pos_type length;
  ifstream file;
  beatnik b;
  array<float,_128UL> buffer;
  unsigned_long step_bytes;
  int_t step_size;
  char **argv_local;
  int argc_local;
  
  re::beatnik::beatnik<float,_1024L,_128L,_2048L,_128L>::beatnik
            ((beatnik<float,_1024L,_128L,_2048L,_128L> *)&stack0xffffffffffee8790,48000.0);
  pcVar1 = argv[1];
  _Var3 = re::std::operator|(_S_bin,_S_ate);
  std::ifstream::ifstream(&length._M_state,pcVar1,_Var3);
  std::istream::tellg();
  length._M_off = extraout_RDX;
  re::std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&stack0xffffffffffee8558,0);
  std::istream::seekg(&length._M_state,in_stack_ffffffffffee8558,in_stack_ffffffffffee8560);
  while( true ) {
    std::istream::tellg();
    sVar4 = std::fpos::operator_cast_to_long((fpos *)&stack0xffffffffffee8548);
    sVar5 = std::fpos::operator_cast_to_long((fpos *)&stack0xffffffffffee8578);
    if (sVar5 <= sVar4) break;
    pvVar6 = re::std::array<float,_128UL>::operator[]((array<float,_128UL> *)&b.counter,0);
    std::istream::read((char *)&length._M_state,(long)pvVar6);
    lVar7 = std::istream::gcount();
    if (lVar7 != 0x200) break;
    gsl::span<float_const,128l>::span<128ul,float>
              ((span<float_const,128l> *)&stack0xffffffffffee8540,(array<float,_128UL> *)&b.counter)
    ;
    bVar2 = re::beatnik::beatnik<float,_1024L,_128L,_2048L,_128L>::process
                      ((beatnik<float,_1024L,_128L,_2048L,_128L> *)&stack0xffffffffffee8790,
                       in_stack_ffffffffffee8540);
    if (bVar2) {
      fVar8 = re::beatnik::beatnik<float,_1024L,_128L,_2048L,_128L>::estimate_tempo
                        ((beatnik<float,_1024L,_128L,_2048L,_128L> *)&stack0xffffffffffee8790);
      printf("%03.3f BPM\r",(double)fVar8);
      fflush(_stdout);
    }
  }
  fVar8 = re::beatnik::beatnik<float,_1024L,_128L,_2048L,_128L>::estimate_tempo
                    ((beatnik<float,_1024L,_128L,_2048L,_128L> *)&stack0xffffffffffee8790);
  printf("%03.3f BPM\n\n",(double)fVar8);
  std::ifstream::~ifstream(&length._M_state);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	using beatnik = re::beatnik::beatnik<>;
	constexpr auto const step_size = beatnik::fft_step;
	constexpr auto const step_bytes = step_size * sizeof(beatnik::float_t);

	std::array<float, step_size> buffer;
	beatnik b(48000);

	Expects(argc >= 2);
	/* header-less sequence of mono f32 samples @ 48kHz */
	std::ifstream file(argv[1], std::ios::binary | std::ios::ate);
	auto length = file.tellg();
	file.seekg(0);

	while(file.tellg() < length) {
		file.read(reinterpret_cast<char*>(&buffer[0]), step_bytes);
		if (file.gcount() != step_bytes) break;
		if (b.process(buffer)) { /* estimate ready */
			printf("%03.3f BPM\r", b.estimate_tempo());
			fflush(stdout);
		}

	}
	printf("%03.3f BPM\n\n", b.estimate_tempo());
	return 0;
}